

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O0

int If_CutPerformCheck08(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  word local_b8;
  word pF [16];
  int fDerive;
  int nSupp;
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  If_Man_t *p_local;
  
  pF[0xf]._0_4_ = 0;
  if (nLeaves < 6) {
    p_local._4_4_ = 1;
  }
  else {
    If_Dec08Copy(&local_b8,(word *)pTruth,nVars);
    pF[0xf]._4_4_ = If_Dec08Support(&local_b8,nLeaves);
    if ((pF[0xf]._4_4_ != 0) && (iVar1 = If_DecSuppIsMinBase(pF[0xf]._4_4_), iVar1 != 0)) {
      iVar1 = If_Dec08Perform(&local_b8,nLeaves,(int)pF[0xf]);
      if (iVar1 != 0) {
        return 1;
      }
      return 0;
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int If_CutPerformCheck08( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
	int nSupp, fDerive = 0;
    word pF[16];
    if ( nLeaves <= 5 )
        return 1;
    If_Dec08Copy( pF, (word *)pTruth, nVars );
    nSupp = If_Dec08Support( pF, nLeaves );
    if ( !nSupp || !If_DecSuppIsMinBase(nSupp) )
        return 0;
    if ( If_Dec08Perform( pF, nLeaves, fDerive ) )
    {
//        printf( "1" );
        return 1;
//        If_Dec08Verify( t, nLeaves, NULL );
    }
//    printf( "0" );
    return 0;
}